

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truc_policy.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
PackageTRUCChecks_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTransactionRef *ptx,int64_t vsize,Package *package,
          setEntries *mempool_ancestors)

{
  undefined8 *puVar1;
  Wtxid *this;
  Txid *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  size_t sVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar6;
  pointer psVar7;
  element_type *peVar8;
  int iVar9;
  _Rb_tree_node_base *p_Var10;
  ulong uVar11;
  undefined8 uVar12;
  int iVar13;
  pointer psVar14;
  pointer pCVar15;
  long lVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  pointer puVar17;
  long in_FS_OFFSET;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> in_package_parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0._0_8_ = vsize;
  FindInPackageParents(&local_f8,package,ptx);
  peVar3 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3->version == 3) {
    if ((long)local_e0._0_8_ < 0x2711) {
      sVar4 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      lVar16 = (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((sVar4 + lVar16) - 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xfffffffffffffffc <
          args_1) {
        if (lVar16 + sVar4 == 0) goto LAB_0048d140;
        if (1000 < (long)local_e0._0_8_) {
          base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
                    (&local_58,
                     (tinyformat *)
                     "version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                     (char *)&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &TRUC_CHILD_MAX_VSIZE,(long *)in_stack_fffffffffffffee8);
          goto LAB_0048d043;
        }
        if (sVar4 == 0) {
          uVar11 = *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          psVar14 = (package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(package->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
              uVar11) {
LAB_0048d94e:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar12 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,uVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (ulong *)0x0) {
                operator_delete(local_f8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_f8.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_f8.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar12);
              }
            }
            goto LAB_0048dbd9;
          }
          psVar14 = psVar14 + uVar11;
          bVar18 = true;
        }
        else {
          psVar14 = *(pointer *)
                     ((mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1)
          ;
          bVar18 = psVar14[0xc].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
        }
        peVar6 = (psVar14->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        this = &peVar6->m_witness_hash;
        this_00 = &peVar6->hash;
        if (peVar6->version == 3) {
          psVar14 = (package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar7 = (package->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (psVar14 != psVar7) {
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10);
            do {
              peVar3 = (psVar14->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              peVar8 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              if (peVar3 == peVar8) {
                iVar9 = 3;
              }
              else {
                iVar9 = 0;
                for (pCVar15 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    pCVar15 !=
                    (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish; pCVar15 = pCVar15 + 1) {
                  auVar21[0] = -(*(char *)&this_00->m_wrapped ==
                                *(char *)&(pCVar15->prevout).hash.m_wrapped.super_base_blob<256U>.
                                          m_data);
                  auVar21[1] = -(*(uchar *)((long)&peVar6->hash + 1) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 1));
                  auVar21[2] = -(*(uchar *)((long)&peVar6->hash + 2) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 2));
                  auVar21[3] = -(*(uchar *)((long)&peVar6->hash + 3) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 3));
                  auVar21[4] = -(*(uchar *)((long)&peVar6->hash + 4) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 4));
                  auVar21[5] = -(*(uchar *)((long)&peVar6->hash + 5) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 5));
                  auVar21[6] = -(*(uchar *)((long)&peVar6->hash + 6) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 6));
                  auVar21[7] = -(*(uchar *)((long)&peVar6->hash + 7) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 7));
                  auVar21[8] = -(*(uchar *)((long)&peVar6->hash + 8) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 8));
                  auVar21[9] = -(*(uchar *)((long)&peVar6->hash + 9) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 9));
                  auVar21[10] = -(*(uchar *)((long)&peVar6->hash + 10) ==
                                 *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                   super_base_blob<256U>.m_data + 10));
                  auVar21[0xb] = -(*(uchar *)((long)&peVar6->hash + 0xb) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xb));
                  auVar21[0xc] = -(*(uchar *)((long)&peVar6->hash + 0xc) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xc));
                  auVar21[0xd] = -(*(uchar *)((long)&peVar6->hash + 0xd) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xd));
                  auVar21[0xe] = -(*(uchar *)((long)&peVar6->hash + 0xe) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xe));
                  auVar21[0xf] = -(*(uchar *)((long)&peVar6->hash + 0xf) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xf));
                  auVar19[0] = -(*(uchar *)((long)&peVar6->hash + 0x10) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x10));
                  auVar19[1] = -(*(uchar *)((long)&peVar6->hash + 0x11) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x11));
                  auVar19[2] = -(*(uchar *)((long)&peVar6->hash + 0x12) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x12));
                  auVar19[3] = -(*(uchar *)((long)&peVar6->hash + 0x13) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x13));
                  auVar19[4] = -(*(uchar *)((long)&peVar6->hash + 0x14) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x14));
                  auVar19[5] = -(*(uchar *)((long)&peVar6->hash + 0x15) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x15));
                  auVar19[6] = -(*(uchar *)((long)&peVar6->hash + 0x16) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x16));
                  auVar19[7] = -(*(uchar *)((long)&peVar6->hash + 0x17) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x17));
                  auVar19[8] = -(*(uchar *)((long)&peVar6->hash + 0x18) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x18));
                  auVar19[9] = -(*(uchar *)((long)&peVar6->hash + 0x19) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x19));
                  auVar19[10] = -(*(uchar *)((long)&peVar6->hash + 0x1a) ==
                                 *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                   super_base_blob<256U>.m_data + 0x1a));
                  auVar19[0xb] = -(*(uchar *)((long)&peVar6->hash + 0x1b) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1b));
                  auVar19[0xc] = -(*(uchar *)((long)&peVar6->hash + 0x1c) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1c));
                  auVar19[0xd] = -(*(uchar *)((long)&peVar6->hash + 0x1d) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1d));
                  auVar19[0xe] = -(*(uchar *)((long)&peVar6->hash + 0x1e) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1e));
                  auVar19[0xf] = -(*(uchar *)((long)&peVar6->hash + 0x1f) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1f));
                  auVar19 = auVar19 & auVar21;
                  if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
                    base_blob<256u>::ToString_abi_cxx11_(&local_78,this_00);
                    base_blob<256u>::ToString_abi_cxx11_(&local_98,this);
                    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                              (&local_58,
                               (tinyformat *)"tx %s (wtxid=%s) would exceed descendant count limit",
                               (char *)&local_78,&local_98,args_1);
LAB_0048d5fb:
                    *(undefined8 **)
                     &(__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload = puVar1;
                    paVar2 = &local_58.field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_58._M_dataplus._M_p == paVar2) {
                      *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]);
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x18) = local_58.field_2._8_8_;
                    }
                    else {
                      (__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
                      *(ulong *)((long)&(__return_storage_ptr__->
                                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                        )._M_payload.
                                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ._M_payload + 0x10) =
                           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                    local_58.field_2._M_local_buf[0]);
                    }
                    (__return_storage_ptr__->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length = local_58._M_string_length;
                    local_58._M_string_length = 0;
                    local_58.field_2._M_local_buf[0] = '\0';
                    (__return_storage_ptr__->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged = true;
                    local_58._M_dataplus._M_p = (pointer)paVar2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_98._M_dataplus._M_p != &local_98.field_2) {
                      operator_delete(local_98._M_dataplus._M_p,
                                      local_98.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_78._M_dataplus._M_p != &local_78.field_2) {
                      operator_delete(local_78._M_dataplus._M_p,
                                      local_78.field_2._M_allocated_capacity + 1);
                    }
                    iVar9 = 1;
                    break;
                  }
                  auVar22[0] = -((peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]
                                == (pCVar15->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems[0]);
                  auVar22[1] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 1) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 1));
                  auVar22[2] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 2) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 2));
                  auVar22[3] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 3) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 3));
                  auVar22[4] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 4) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 4));
                  auVar22[5] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 5) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 5));
                  auVar22[6] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 6) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 6));
                  auVar22[7] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 7) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 7));
                  auVar22[8] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 8) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 8));
                  auVar22[9] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 9) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 9));
                  auVar22[10] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                   m_data._M_elems + 10) ==
                                 *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                   super_base_blob<256U>.m_data + 10));
                  auVar22[0xb] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0xb) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xb));
                  auVar22[0xc] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0xc) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xc));
                  auVar22[0xd] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0xd) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xd));
                  auVar22[0xe] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0xe) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xe));
                  auVar22[0xf] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0xf) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0xf));
                  auVar20[0] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x10) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x10));
                  auVar20[1] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x11) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x11));
                  auVar20[2] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x12) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x12));
                  auVar20[3] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x13) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x13));
                  auVar20[4] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x14) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x14));
                  auVar20[5] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x15) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x15));
                  auVar20[6] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x16) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x16));
                  auVar20[7] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x17) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x17));
                  auVar20[8] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x18) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x18));
                  auVar20[9] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x19) ==
                                *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                  super_base_blob<256U>.m_data + 0x19));
                  auVar20[10] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                   m_data._M_elems + 0x1a) ==
                                 *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                   super_base_blob<256U>.m_data + 0x1a));
                  auVar20[0xb] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0x1b) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1b));
                  auVar20[0xc] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0x1c) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1c));
                  auVar20[0xd] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0x1d) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1d));
                  auVar20[0xe] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0x1e) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1e));
                  auVar20[0xf] = -(*(uchar *)((long)(peVar8->hash).m_wrapped.super_base_blob<256U>.
                                                    m_data._M_elems + 0x1f) ==
                                  *(uchar *)((long)&(pCVar15->prevout).hash.m_wrapped.
                                                    super_base_blob<256U>.m_data + 0x1f));
                  auVar20 = auVar20 & auVar22;
                  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
                    base_blob<256u>::ToString_abi_cxx11_
                              (&local_78,
                               &((psVar14->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->hash);
                    base_blob<256u>::ToString_abi_cxx11_
                              (&local_98,
                               &((psVar14->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->m_witness_hash);
                    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                              (&local_58,
                               (tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
                               (char *)&local_78,&local_98,args_1);
                    goto LAB_0048d5fb;
                  }
                }
              }
              if ((iVar9 != 3) && (iVar9 != 0)) goto LAB_0048d6c7;
              psVar14 = psVar14 + 1;
            } while (psVar14 != psVar7);
          }
          iVar9 = 2;
LAB_0048d6c7:
          iVar13 = 0;
          if (iVar9 != 2) {
            iVar13 = iVar9;
          }
          if (iVar9 == 2 && !bVar18) {
            base_blob<256u>::ToString_abi_cxx11_(&local_78,this_00);
            base_blob<256u>::ToString_abi_cxx11_(&local_98,this);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_58,
                       (tinyformat *)"tx %s (wtxid=%s) would exceed descendant count limit",
                       (char *)&local_78,&local_98,args_1);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload = puVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p == &local_58.field_2) {
              *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x18) = local_58.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload + 0x10) =
                   CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                            local_58.field_2._M_local_buf[0]);
            }
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length = local_58._M_string_length;
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = true;
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            goto LAB_0048d88b;
          }
        }
        else {
          base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          base_blob<256u>::ToString_abi_cxx11_(&local_b8,this_00);
          base_blob<256u>::ToString_abi_cxx11_((string *)(local_e0 + 8),this);
          tinyformat::
          format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_58,
                     (tinyformat *)
                     "version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                     (char *)&local_78,&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_e0 + 8),in_stack_fffffffffffffee8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload = puVar1;
          paVar2 = &local_58.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == paVar2) {
            *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x18) = local_58.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10) =
                 CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                          local_58.field_2._M_local_buf[0]);
          }
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = local_58._M_string_length;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = true;
          local_58._M_dataplus._M_p = (pointer)paVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._8_8_ != &local_c8) {
            operator_delete((void *)local_e0._8_8_,local_c8._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
LAB_0048d88b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          iVar13 = 1;
        }
        if (iVar13 == 0) goto LAB_0048d140;
        goto LAB_0048d144;
      }
      base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_58,(tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
                 (char *)&local_78,&local_98,args_1);
    }
    else {
      base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar3->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
                (&local_58,
                 (tinyformat *)"version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                 (char *)&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &TRUC_MAX_VSIZE,(long *)in_stack_fffffffffffffee8);
    }
LAB_0048d043:
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                         local_58.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload + 0x18) = local_58.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10) =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
LAB_0048d0f3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    for (p_Var10 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      plVar5 = *(long **)(p_Var10 + 1);
      if (*(int *)(*plVar5 + 0x30) == 3) {
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_78,
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_98,
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        lVar16 = *plVar5;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        base_blob<256u>::ToString_abi_cxx11_(&local_b8,(void *)(lVar16 + 0x39));
        lVar16 = *plVar5;
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_02->_M_use_count = this_02->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_02->_M_use_count = this_02->_M_use_count + 1;
          }
        }
        base_blob<256u>::ToString_abi_cxx11_((string *)(local_e0 + 8),(void *)(lVar16 + 0x59));
        tinyformat::
        format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_58,
                   (tinyformat *)
                   "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                   (char *)&local_78,&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 8),in_stack_fffffffffffffee8);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload = puVar1;
        paVar2 = &local_58.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x18) = local_58.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10) =
               CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = local_58._M_string_length;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = true;
        local_58._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._8_8_ != &local_c8) {
          operator_delete((void *)local_e0._8_8_,local_c8._0_8_ + 1);
        }
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        goto LAB_0048d0f3;
      }
    }
    if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      psVar14 = (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar17 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if ((ulong)((long)(package->
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            *puVar17) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0048dbd9;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0048d904:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0048dbd9;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0048d929:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0048dbd9;
          uVar11 = std::__throw_out_of_range_fmt
                             (
                             "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             );
          goto LAB_0048d94e;
        }
        if ((psVar14[*puVar17].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->version == 3) {
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_78,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          psVar14 = (package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(package->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
              *puVar17) goto LAB_0048d904;
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_b8,
                     &(psVar14[*puVar17].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      hash);
          psVar14 = (package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(package->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
              *puVar17) goto LAB_0048d929;
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)(local_e0 + 8),
                     &(psVar14[*puVar17].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      m_witness_hash);
          tinyformat::
          format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_58,
                     (tinyformat *)
                     "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                     (char *)&local_78,&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_e0 + 8),in_stack_fffffffffffffee8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload = puVar1;
          paVar2 = &local_58.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == paVar2) {
            *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x18) = local_58.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10) =
                 CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                          local_58.field_2._M_local_buf[0]);
          }
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = local_58._M_string_length;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = true;
          local_58._M_dataplus._M_p = (pointer)paVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._8_8_ != &local_c8) {
            operator_delete((void *)local_e0._8_8_,local_c8._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0048d0f3;
        }
        puVar17 = puVar17 + 1;
      } while (puVar17 !=
               local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
LAB_0048d140:
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
LAB_0048d144:
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0048dbd9:
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> PackageTRUCChecks(const CTransactionRef& ptx, int64_t vsize,
                                           const Package& package,
                                           const CTxMemPool::setEntries& mempool_ancestors)
{
    // This function is specialized for these limits, and must be reimplemented if they ever change.
    static_assert(TRUC_ANCESTOR_LIMIT == 2);
    static_assert(TRUC_DESCENDANT_LIMIT == 2);

    const auto in_package_parents{FindInPackageParents(package, ptx)};

    // Now we have all ancestors, so we can start checking TRUC rules.
    if (ptx->version == TRUC_VERSION) {
        // SingleTRUCChecks should have checked this already.
        if (!Assume(vsize <= TRUC_MAX_VSIZE)) {
            return strprintf("version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_MAX_VSIZE);
        }

        if (mempool_ancestors.size() + in_package_parents.size() + 1 > TRUC_ANCESTOR_LIMIT) {
            return strprintf("tx %s (wtxid=%s) would have too many ancestors",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString());
        }

        const bool has_parent{mempool_ancestors.size() + in_package_parents.size() > 0};
        if (has_parent) {
            // A TRUC child cannot be too large.
            if (vsize > TRUC_CHILD_MAX_VSIZE) {
                return strprintf("version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 vsize, TRUC_CHILD_MAX_VSIZE);
            }

            // Exactly 1 parent exists, either in mempool or package. Find it.
            const auto parent_info = [&] {
                if (mempool_ancestors.size() > 0) {
                    auto& mempool_parent = *mempool_ancestors.begin();
                    return ParentInfo{mempool_parent->GetTx().GetHash(),
                                      mempool_parent->GetTx().GetWitnessHash(),
                                      mempool_parent->GetTx().version,
                                      /*has_mempool_descendant=*/mempool_parent->GetCountWithDescendants() > 1};
                } else {
                    auto& parent_index = in_package_parents.front();
                    auto& package_parent = package.at(parent_index);
                    return ParentInfo{package_parent->GetHash(),
                                      package_parent->GetWitnessHash(),
                                      package_parent->version,
                                      /*has_mempool_descendant=*/false};
                }
            }();

            // If there is a parent, it must have the right version.
            if (parent_info.m_version != TRUC_VERSION) {
                return strprintf("version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 parent_info.m_txid.ToString(), parent_info.m_wtxid.ToString());
            }

            for (const auto& package_tx : package) {
                // Skip same tx.
                if (&(*package_tx) == &(*ptx)) continue;

                for (auto& input : package_tx->vin) {
                    // Fail if we find another tx with the same parent. We don't check whether the
                    // sibling is to-be-replaced (done in SingleTRUCChecks) because these transactions
                    // are within the same package.
                    if (input.prevout.hash == parent_info.m_txid) {
                        return strprintf("tx %s (wtxid=%s) would exceed descendant count limit",
                                         parent_info.m_txid.ToString(),
                                         parent_info.m_wtxid.ToString());
                    }

                    // This tx can't have both a parent and an in-package child.
                    if (input.prevout.hash == ptx->GetHash()) {
                        return strprintf("tx %s (wtxid=%s) would have too many ancestors",
                                         package_tx->GetHash().ToString(), package_tx->GetWitnessHash().ToString());
                    }
                }
            }

            if (parent_info.m_has_mempool_descendant) {
                return strprintf("tx %s (wtxid=%s) would exceed descendant count limit",
                                parent_info.m_txid.ToString(), parent_info.m_wtxid.ToString());
            }
        }
    } else {
        // Non-TRUC transactions cannot have TRUC parents.
        for (auto it : mempool_ancestors) {
            if (it->GetTx().version == TRUC_VERSION) {
                return strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                                 it->GetSharedTx()->GetHash().ToString(), it->GetSharedTx()->GetWitnessHash().ToString());
            }
        }
        for (const auto& index: in_package_parents) {
            if (package.at(index)->version == TRUC_VERSION) {
                return strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                                 ptx->GetHash().ToString(),
                                 ptx->GetWitnessHash().ToString(),
                                 package.at(index)->GetHash().ToString(),
                                 package.at(index)->GetWitnessHash().ToString());
            }
        }
    }
    return std::nullopt;
}